

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagholder.cpp
# Opt level: O0

Value * __thiscall
camp::TagHolder::tag(Value *__return_storage_ptr__,TagHolder *this,Value *id,UserObject *object)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  UserObject *object_local;
  Value *id_local;
  TagHolder *this_local;
  
  it._M_node = (_Base_ptr)object;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<camp::Value,_camp::detail::Getter<camp::Value>,_std::less<camp::Value>,_std::allocator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>_>
       ::find(&this->m_tags,id);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<camp::Value,_camp::detail::Getter<camp::Value>,_std::less<camp::Value>,_std::allocator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>_>
       ::end(&this->m_tags);
  bVar1 = std::operator!=(&local_30,&local_38);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>
             ::operator->(&local_30);
    detail::Getter<camp::Value>::get
              (__return_storage_ptr__,&ppVar2->second,(UserObject *)it._M_node);
  }
  else {
    Value::Value(__return_storage_ptr__,(Value *)Value::nothing);
  }
  return __return_storage_ptr__;
}

Assistant:

Value TagHolder::tag(const Value& id, const UserObject& object) const
{
    TagsTable::const_iterator it = m_tags.find(id);
    if (it != m_tags.end())
        return it->second.get(object);

    return Value::nothing;
}